

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Compare(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pGia0_00;
  Gia_Man_t *pGia1_00;
  long lVar3;
  char *pcVar4;
  int fVerbose;
  int c;
  int nArgcNew;
  char **pArgvNew;
  Gia_Man_t *pGia1;
  Gia_Man_t *pGia0;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar2 == -1) {
      lVar3 = (long)globalUtilOptind;
      if (argc - globalUtilOptind == 2) {
        pGia0_00 = Gia_AigerRead(argv[lVar3],0,0,0);
        pGia1_00 = Gia_AigerRead((argv + lVar3)[1],0,0,0);
        if ((pGia0_00 == (Gia_Man_t *)0x0) || (pGia1_00 == (Gia_Man_t *)0x0)) {
          Abc_Print(-1,"Abc_CommandAbc9Compare(): Reading input files did not work.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          Gia_Iso4TestTwo(pGia0_00,pGia1_00);
          Gia_ManStop(pGia0_00);
          Gia_ManStop(pGia1_00);
          pAbc_local._4_4_ = 0;
        }
      }
      else {
        Abc_Print(-1,
                  "Abc_CommandAbc9Compare(): This command expects two AIG file names on the command line.\n"
                 );
        pAbc_local._4_4_ = 1;
      }
      return pAbc_local._4_4_;
    }
    if ((iVar2 == 0x68) || (iVar2 != 0x76)) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
  Abc_Print(-2,"usage: &compare <file1> <file2> [-vh]\n");
  Abc_Print(-2,"\t         compared two AIGs for structural similarity\n");
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Compare( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_Iso4TestTwo( Gia_Man_t * pGia0, Gia_Man_t * pGia1 );
    Gia_Man_t * pGia0, * pGia1;
    char ** pArgvNew; int nArgcNew;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 2 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Compare(): This command expects two AIG file names on the command line.\n" );
        return 1;
    }
    pGia0 = Gia_AigerRead( pArgvNew[0], 0, 0, 0 );
    pGia1 = Gia_AigerRead( pArgvNew[1], 0, 0, 0 );
    if ( pGia0 == NULL || pGia1 == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Compare(): Reading input files did not work.\n" );
        return 1;
    }
    Gia_Iso4TestTwo( pGia0, pGia1 );
    Gia_ManStop( pGia0 );
    Gia_ManStop( pGia1 );
    return 0;

usage:
    Abc_Print( -2, "usage: &compare <file1> <file2> [-vh]\n" );
    Abc_Print( -2, "\t         compared two AIGs for structural similarity\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}